

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O3

void __thiscall
duckdb::SQLLogicTestLogger::ColumnCountMismatch
          (SQLLogicTestLogger *this,MaterializedQueryResult *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *result_values_string,idx_t expected_column_count,bool row_wise)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Wrong column count in query!","");
  PrintErrorHeader(&this->file_name,(long)this->query_line,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expected ",9);
  puVar4 = (undefined8 *)&stderr;
  if (_stderr == (FILE *)0x0) {
LAB_00457de5:
    lVar2 = *(long *)(std::cerr + -0x18);
    if (termcolor::_internal::colorize_index < *(uint *)(&EncryptionState::typeinfo + lVar2)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(duckdb::BaseAppender::Append<unsigned_short> + lVar2);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)lVar2 + 0x5d7fe8,SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) != 0) goto LAB_00457e21;
  }
  else {
    iVar1 = fileno(_stderr);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_00457de5;
LAB_00457e21:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[1m",4);
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  if (poVar3 == (ostream *)&std::cout) {
    puVar4 = (undefined8 *)&stdout;
LAB_00457e7a:
    if ((FILE *)*puVar4 == (FILE *)0x0) goto LAB_00457e93;
    iVar1 = fileno((FILE *)*puVar4);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_00457e93;
LAB_00457ecf:
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[00m",5);
  }
  else {
    if (poVar3 == (ostream *)&std::cerr || poVar3 == (ostream *)&std::clog) goto LAB_00457e7a;
LAB_00457e93:
    if (termcolor::_internal::colorize_index <
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0xc0)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 200);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)),
                         SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) != 0) goto LAB_00457ecf;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," columns, but got ",0x12);
  if (poVar3 == (ostream *)&std::cout) {
    puVar4 = (undefined8 *)&stdout;
LAB_00457f28:
    if ((FILE *)*puVar4 == (FILE *)0x0) goto LAB_00457f40;
    iVar1 = fileno((FILE *)*puVar4);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_00457f40;
LAB_00457f7e:
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[1m",4);
  }
  else {
    if (poVar3 == (ostream *)&std::cerr || poVar3 == (ostream *)&std::clog) {
      puVar4 = (undefined8 *)&stderr;
      goto LAB_00457f28;
    }
LAB_00457f40:
    if (termcolor::_internal::colorize_index <
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0xc0)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 200);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)),
                         SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) != 0) goto LAB_00457f7e;
  }
  duckdb::BaseQueryResult::ColumnCount();
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  if (poVar3 == (ostream *)&std::cout) {
    puVar4 = (undefined8 *)&stdout;
LAB_00457fdc:
    if ((FILE *)*puVar4 == (FILE *)0x0) goto LAB_00457ff4;
    iVar1 = fileno((FILE *)*puVar4);
    iVar1 = isatty(iVar1);
    if (iVar1 == 0) goto LAB_00457ff4;
  }
  else {
    if (poVar3 == (ostream *)&std::cerr || poVar3 == (ostream *)&std::clog) {
      puVar4 = (undefined8 *)&stderr;
      goto LAB_00457fdc;
    }
LAB_00457ff4:
    if (termcolor::_internal::colorize_index <
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0xc0)) {
      lVar2 = (long)(int)termcolor::_internal::colorize_index * 0x10 +
              *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 200);
    }
    else {
      lVar2 = std::ios_base::_M_grow_words
                        ((int)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)),
                         SUB41(termcolor::_internal::colorize_index,0));
    }
    if (*(long *)(lVar2 + 8) == 0) goto LAB_00458046;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[00m",5);
LAB_00458046:
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," columns",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  PrintLineSep();
  PrintSQL(this);
  PrintLineSep();
  PrintResultError(this,result,result_values_string,expected_column_count,row_wise);
  return;
}

Assistant:

void SQLLogicTestLogger::ColumnCountMismatch(MaterializedQueryResult &result,
                                             const vector<string> &result_values_string, idx_t expected_column_count,
                                             bool row_wise) {
	PrintErrorHeader("Wrong column count in query!");
	std::cerr << "Expected " << termcolor::bold << expected_column_count << termcolor::reset << " columns, but got "
	          << termcolor::bold << result.ColumnCount() << termcolor::reset << " columns" << std::endl;
	PrintLineSep();
	PrintSQL();
	PrintLineSep();
	PrintResultError(result, result_values_string, expected_column_count, row_wise);
}